

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SpectrumTextureHandle
pbrt::SpectrumScaledTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  TextureEvalContext ctx;
  FloatConstantTexture *this;
  SpectrumImageTexture *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RDI;
  undefined8 in_R8;
  undefined1 auVar2 [64];
  Float FVar3;
  SpectrumImageTexture *imageCopy;
  SpectrumImageTexture *image;
  Float cs;
  FloatConstantTexture *cscale;
  FloatTextureHandle scale;
  SpectrumTextureHandle tex;
  SpectrumHandle one;
  TextureEvalContext *this_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [40];
  undefined1 auVar7 [48];
  undefined1 in_stack_fffffffffffffe68 [64];
  Allocator in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  allocator<char> *fmt;
  int line;
  TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  LogLevel level;
  undefined8 local_110;
  char *in_stack_fffffffffffffef8;
  undefined4 uStack_100;
  int in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  undefined4 uStack_f0;
  LogLevel in_stack_ffffffffffffff14;
  undefined1 auStack_e8 [24];
  allocator<char> local_b1;
  string local_b0 [40];
  undefined8 local_88;
  allocator<char> local_61;
  string local_60 [40];
  undefined8 local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined8 local_10;
  undefined1 auVar8 [56];
  
  local_38 = 0x3ff0000000000000;
  file.bits = (uintptr_t)in_RDI;
  local_20 = in_RDX;
  local_10 = in_R8;
  pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,double>
            (in_stack_fffffffffffffe68._24_8_,in_stack_fffffffffffffe68._16_8_);
  line = (int)((ulong)in_RDI >> 0x20);
  SpectrumHandle::TaggedPointer<pbrt::ConstantSpectrum>
            (in_stack_fffffffffffffe68._8_8_,in_stack_fffffffffffffe68._0_8_);
  pbVar9 = local_20;
  std::allocator<char>::allocator();
  level = (LogLevel)((ulong)pbVar9 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8.memoryResource,
             in_stack_fffffffffffffe68._56_8_);
  auVar8 = in_stack_fffffffffffffe68._8_56_;
  SpectrumHandle::SpectrumHandle(in_stack_fffffffffffffe68._8_8_,in_stack_fffffffffffffe68._0_8_);
  local_88 = local_10;
  TextureParameterDictionary::GetSpectrumTexture
            (auVar8._48_8_,auVar8._40_8_,auVar8._32_8_,auVar8._28_4_,in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  fmt = &local_b1;
  std::allocator<char>::allocator();
  auVar7 = auVar8._0_48_;
  std::__cxx11::string::string<std::allocator<char>>
            (local_20,(char *)in_stack_fffffffffffffea8.memoryResource,auVar8._48_8_);
  auVar6 = auVar7._0_40_;
  TextureParameterDictionary::GetFloatTexture
            (auVar7._32_8_,auVar7._24_8_,auVar7._20_4_,auVar7._40_8_);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  auVar5 = auVar6._8_32_;
  this = TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
         ::CastOrNullptr<pbrt::FloatConstantTexture>(auVar6._0_8_);
  this_00 = auVar5._8_8_;
  if (this != (FloatConstantTexture *)0x0) {
    memset(&local_110,0,0x40);
    TextureEvalContext::TextureEvalContext(this_00);
    auVar2._8_8_ = in_stack_fffffffffffffef8;
    auVar2._0_8_ = local_110;
    auVar2._16_4_ = uStack_100;
    auVar2._20_4_ = in_stack_ffffffffffffff04;
    auVar2._24_8_ = in_stack_ffffffffffffff08;
    auVar2._32_4_ = uStack_f0;
    auVar2._36_4_ = in_stack_ffffffffffffff14;
    auVar2._40_24_ = auStack_e8;
    auVar2 = vmovdqu64_avx512f(auVar2);
    ctx = (TextureEvalContext)vmovdqu64_avx512f(auVar2);
    auVar5 = ctx._0_32_;
    FVar3 = FloatConstantTexture::Evaluate(this,ctx);
    auVar4 = auVar5._0_16_;
    if ((FVar3 == 1.0) && (!NAN(FVar3))) {
      if (LOGGING_LogLevel < 1) {
        Log(in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
            in_stack_fffffffffffffef8);
      }
      SpectrumTextureHandle::SpectrumTextureHandle(auVar4._8_8_,auVar4._0_8_);
      return (SpectrumTextureHandle)
             (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              )file.bits;
    }
    pSVar1 = TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             ::CastOrNullptr<pbrt::SpectrumImageTexture>(auVar5._0_8_);
    auVar4 = auVar5._0_16_;
    if (pSVar1 != (SpectrumImageTexture *)0x0) {
      pSVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::SpectrumImageTexture,pbrt::SpectrumImageTexture&>
                         (auVar5._24_8_,auVar5._16_8_);
      if (LOGGING_LogLevel < 1) {
        Log<float&>(level,(char *)file.bits,line,(char *)fmt,(float *)local_20);
      }
      (pSVar1->super_ImageTextureBase).scale = FVar3 * (pSVar1->super_ImageTextureBase).scale;
      SpectrumTextureHandle::TaggedPointer<pbrt::SpectrumImageTexture>(auVar4._8_8_,auVar4._0_8_);
      return (SpectrumTextureHandle)
             (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              )file.bits;
    }
  }
  auVar4 = auVar5._0_16_;
  pstd::pmr::polymorphic_allocator<std::byte>::
  new_object<pbrt::SpectrumScaledTexture,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&>
            (auVar5._24_8_,auVar5._16_8_,auVar5._8_8_);
  SpectrumTextureHandle::TaggedPointer<pbrt::SpectrumScaledTexture>(auVar4._8_8_,auVar4._0_8_);
  return (SpectrumTextureHandle)
         (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          )file.bits;
}

Assistant:

SpectrumTextureHandle SpectrumScaledTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    SpectrumTextureHandle tex =
        parameters.GetSpectrumTexture("tex", one, SpectrumType::Reflectance, alloc);
    FloatTextureHandle scale = parameters.GetFloatTexture("scale", 1.f, alloc);

    if (FloatConstantTexture *cscale = scale.CastOrNullptr<FloatConstantTexture>()) {
        Float cs = cscale->Evaluate({});
        if (cs == 1) {
            LOG_VERBOSE("Dropping useless scale by 1");
            return tex;
        } else if (SpectrumImageTexture *image =
                       tex.CastOrNullptr<SpectrumImageTexture>()) {
            SpectrumImageTexture *imageCopy =
                alloc.new_object<SpectrumImageTexture>(*image);
            LOG_VERBOSE("Flattened scale %f * image texture", cs);
            imageCopy->scale *= cs;
            return imageCopy;
        }
#if defined(PBRT_BUILD_GPU_RENDERER)
        else if (GPUSpectrumImageTexture *gimage =
                     tex.CastOrNullptr<GPUSpectrumImageTexture>()) {
            GPUSpectrumImageTexture *gimageCopy =
                alloc.new_object<GPUSpectrumImageTexture>(*gimage);
            LOG_VERBOSE("Flattened scale %f * gpu image texture", cs);
            gimageCopy->scale *= cs;
            return gimageCopy;
        }
#endif
    }

    return alloc.new_object<SpectrumScaledTexture>(tex, scale);
}